

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::LdexpCase::getInputValues(LdexpCase *this,int numValues,void **values)

{
  float fVar1;
  Precision PVar2;
  pointer pSVar3;
  deUint32 dVar4;
  uint uVar5;
  int iVar6;
  Float<unsigned_int,_8,_23,_127,_3U> FVar7;
  undefined4 extraout_var;
  int iVar8;
  uint max;
  ulong uVar9;
  int iVar10;
  int caseNdx;
  long lVar11;
  int iVar12;
  undefined4 in_register_00000034;
  bool bVar13;
  float fVar14;
  undefined1 extraout_var_00 [12];
  undefined1 auVar15 [16];
  int in1;
  float in0;
  undefined8 local_80;
  ulong local_78;
  ulong local_70;
  void **local_68;
  int local_60;
  float local_5c;
  Random rnd;
  float local_48 [6];
  
  local_78 = CONCAT44(in_register_00000034,numValues);
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  local_68 = values;
  dVar4 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4 ^ 0x2790a);
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  local_80 = CONCAT44(extraout_var,uVar5);
  iVar10 = 0;
  local_70 = 0;
  if (0 < (int)uVar5) {
    local_70 = (ulong)uVar5;
  }
  for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
    frexp((Functional *)&in0,(double)(ulong)(uint)(&DAT_018a3660)[lVar11],&in1);
    uVar9 = local_70;
    iVar8 = iVar10;
    while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
      *(float *)((long)*local_68 + (long)iVar8 * 4) = in0;
      *(int *)((long)local_68[1] + (long)iVar8 * 4) = in1;
      iVar8 = iVar8 + 1;
    }
    iVar10 = iVar10 + (int)local_80;
  }
  iVar8 = (int)local_78 + -8;
  iVar10 = 0;
  if (0 < iVar8) {
    iVar10 = iVar8;
  }
  iVar8 = 0x3a;
  if (PVar2 != PRECISION_HIGHP) {
    iVar8 = iVar10 + 8;
  }
  iVar6 = (int)local_80 * 8;
  iVar10 = 8;
  while( true ) {
    uVar9 = local_70;
    local_60 = iVar6;
    if (iVar10 == iVar8) break;
    while (bVar13 = uVar9 != 0, uVar9 = uVar9 - 1, bVar13) {
      fVar1 = local_48[(ulong)PVar2 * 2];
      local_5c = local_48[(ulong)PVar2 * 2 + 1] - fVar1;
      fVar14 = deRandom_getFloat(&rnd.m_rnd);
      auVar15._0_4_ = fVar14 * local_5c + fVar1;
      auVar15._4_12_ = extraout_var_00;
      frexp((Functional *)&in0,auVar15._0_8_,&in1);
      *(float *)((long)*local_68 + (long)iVar6 * 4) = in0;
      *(int *)((long)local_68[1] + (long)iVar6 * 4) = in1;
      iVar6 = iVar6 + 1;
    }
    iVar10 = iVar10 + 1;
    iVar6 = local_60 + (int)local_80;
  }
  local_78 = (ulong)(uint)((int)local_78 - iVar8);
  iVar8 = iVar8 * (int)local_80;
  iVar10 = 0;
  while( true ) {
    uVar9 = local_70;
    iVar6 = iVar8;
    if ((int)local_78 <= iVar10) break;
    while( true ) {
      bVar13 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar13) break;
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      uVar5 = dVar4 % 0xfe;
      bVar13 = de::Random::getBool((Random *)&rnd.m_rnd);
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      iVar12 = -uVar5;
      if (iVar12 < -0x7d) {
        iVar12 = -0x7e;
      }
      max = 0xfd - uVar5;
      if (0x7e < max) {
        max = 0x7f;
      }
      iVar12 = de::Random::getInt((Random *)&rnd.m_rnd,iVar12,max);
      FVar7 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                        (-(uint)bVar13 | 1,uVar5 - 0x7e,dVar4 & 0x7fffff | 0x800000);
      ldexp((double)(ulong)FVar7.m_value,iVar12);
      *(StorageType *)((long)*local_68 + (long)iVar6 * 4) = FVar7.m_value;
      *(int *)((long)local_68[1] + (long)iVar6 * 4) = iVar12;
      iVar6 = iVar6 + 1;
    }
    iVar10 = iVar10 + 1;
    iVar8 = iVar8 + (int)local_80;
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd					(deStringHash(getName()) ^ 0x2790au);
		const glu::DataType		type				= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision			= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize			= glu::getDataTypeScalarSize(type);
		int						valueNdx			= 0;

		{
			const float easySpecialCases[] = { 0.0f, -0.0f, 0.5f, -0.5f, 1.0f, -1.0f, 2.0f, -2.0f };

			DE_ASSERT(valueNdx + DE_LENGTH_OF_ARRAY(easySpecialCases) <= numValues);
			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(easySpecialCases); caseNdx++)
			{
				float	in0;
				int		in1;

				frexp(easySpecialCases[caseNdx], &in0, &in1);

				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			// \note lowp and mediump can not necessarily fit the values in hard cases, so we'll use only easy ones.
			const int numEasyRandomCases = precision == glu::PRECISION_HIGHP ? 50 : (numValues-valueNdx);

			DE_ASSERT(valueNdx + numEasyRandomCases <= numValues);
			for (int caseNdx = 0; caseNdx < numEasyRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const float	in	= rnd.getFloat(ranges[precision].x(), ranges[precision].y());
					float		in0;
					int			in1;

					frexp(in, &in0, &in1);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}

		{
			const int numHardRandomCases = numValues-valueNdx;
			DE_ASSERT(numHardRandomCases >= 0 && valueNdx + numHardRandomCases <= numValues);

			for (int caseNdx = 0; caseNdx < numHardRandomCases; caseNdx++)
			{
				for (int compNdx = 0; compNdx < scalarSize; compNdx++)
				{
					const int		fpExp		= rnd.getInt(-126, 127);
					const int		sign		= rnd.getBool() ? -1 : +1;
					const deUint32	mantissa	= (1u<<23) | (rnd.getUint32() & ((1u<<23)-1));
					const int		in1			= rnd.getInt(de::max(-126, -126-fpExp), de::min(127, 127-fpExp));
					const float		in0			= tcu::Float32::construct(sign, fpExp, mantissa).asFloat();

					DE_ASSERT(de::inRange(in1, -126, 127)); // See Khronos bug 11180
					DE_ASSERT(de::inRange(in1+fpExp, -126, 127));

					const float		out			= ldexp(in0, in1);

					DE_ASSERT(!tcu::Float32(out).isInf() && !tcu::Float32(out).isDenorm());
					DE_UNREF(out);

					((float*)values[0])[valueNdx*scalarSize + compNdx] = in0;
					((int*)values[1])[valueNdx*scalarSize + compNdx] = in1;
				}

				valueNdx += 1;
			}
		}
	}